

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O3

int marktime(int *status)

{
  timeval tv;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  startsec = local_20.tv_sec;
  startmilli = (int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_20.tv_usec),8) >> 7) -
               (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_20.tv_usec),0xc) >> 0x1f);
  scpu = clock();
  return *status;
}

Assistant:

int marktime(int *status)
{
#if defined(unix) || defined(__unix__)  || defined(__unix)
        struct  timeval tv;
/*        struct  timezone tz; */

/*        gettimeofday (&tv, &tz); */
        gettimeofday (&tv, NULL);

	startsec = tv.tv_sec;
        startmilli = tv.tv_usec/1000;

        scpu = clock();
#else
/* don't support high timing precision on Windows machines */
     	startsec = 0;
        startmilli = 0;

        scpu = clock();
#endif
	return( *status );
}